

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void client_setup_ech_grease
               (st_ptls_ech_t *ech,_func_void_void_ptr_size_t *random_bytes,ptls_hpke_kem_t **kems,
               ptls_hpke_cipher_suite_t **ciphers,char *sni_name)

{
  ptls_aead_context_t *ppVar1;
  uint8_t *puVar2;
  size_t len;
  char *pcVar3;
  long local_68;
  size_t i_1;
  size_t i;
  uint8_t random_secret [32];
  char *sni_name_local;
  ptls_hpke_cipher_suite_t **ciphers_local;
  ptls_hpke_kem_t **kems_local;
  _func_void_void_ptr_size_t *random_bytes_local;
  st_ptls_ech_t *ech_local;
  
  for (i_1 = 0; kems[i_1] != (ptls_hpke_kem_t *)0x0; i_1 = i_1 + 1) {
    if (kems[i_1]->id == 0x20) {
      ech->kem = kems[i_1];
      break;
    }
  }
  local_68 = 0;
  do {
    if (ciphers[local_68] == (ptls_hpke_cipher_suite_t *)0x0) {
LAB_0011f303:
      if ((ech->kem != (ptls_hpke_kem_t *)0x0) && (ech->cipher != (ptls_hpke_cipher_suite_t *)0x0))
      {
        (*random_bytes)(&i,0x20);
        ppVar1 = ptls_aead_new_direct(ech->cipher->aead,1,&i,random_secret + 8);
        ech->aead = ppVar1;
        puVar2 = (uint8_t *)malloc(0x20);
        (ech->client).enc.base = puVar2;
        if (puVar2 != (uint8_t *)0x0) {
          (ech->client).enc.len = 0x20;
          (*random_bytes)((ech->client).enc.base,(ech->client).enc.len);
          (*random_bytes)(&ech->config_id,1);
          (ech->client).max_name_length = '@';
          len = strlen(sni_name);
          pcVar3 = duplicate_as_str(sni_name,len);
          (ech->client).public_name = pcVar3;
          if (pcVar3 != (char *)0x0) {
            return;
          }
        }
      }
      clear_ech(ech,0);
      return;
    }
    if (((ciphers[local_68]->id).kdf == 1) && ((ciphers[local_68]->id).aead == 1)) {
      ech->cipher = ciphers[local_68];
      goto LAB_0011f303;
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

static void client_setup_ech_grease(struct st_ptls_ech_t *ech, void (*random_bytes)(void *, size_t), ptls_hpke_kem_t **kems,
                                    ptls_hpke_cipher_suite_t **ciphers, const char *sni_name)
{
    static const size_t x25519_key_size = 32;
    uint8_t random_secret[PTLS_AES128_KEY_SIZE + PTLS_AES_IV_SIZE];

    /* pick up X25519, AES-128-GCM or bail out */
    for (size_t i = 0; kems[i] != NULL; ++i) {
        if (kems[i]->id == PTLS_HPKE_KEM_X25519_SHA256) {
            ech->kem = kems[i];
            break;
        }
    }
    for (size_t i = 0; ciphers[i] != NULL; ++i) {
        if (ciphers[i]->id.kdf == PTLS_HPKE_HKDF_SHA256 && ciphers[i]->id.aead == PTLS_HPKE_AEAD_AES_128_GCM) {
            ech->cipher = ciphers[i];
            break;
        }
    }
    if (ech->kem == NULL || ech->cipher == NULL)
        goto Fail;

    /* aead is generated from random */
    random_bytes(random_secret, sizeof(random_secret));
    ech->aead = ptls_aead_new_direct(ech->cipher->aead, 1, random_secret, random_secret + PTLS_AES128_KEY_SIZE);

    /* `enc` is random bytes */
    if ((ech->client.enc.base = malloc(x25519_key_size)) == NULL)
        goto Fail;
    ech->client.enc.len = x25519_key_size;
    random_bytes(ech->client.enc.base, ech->client.enc.len);

    /* setup the rest (inner_client_random is left zeros) */
    random_bytes(&ech->config_id, sizeof(ech->config_id));
    ech->client.max_name_length = 64;
    if ((ech->client.public_name = duplicate_as_str(sni_name, strlen(sni_name))) == NULL)
        goto Fail;

    return;

Fail:
    clear_ech(ech, 0);
}